

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O2

int voctplfnd(voccxdef *ctx,objnum verb_in,objnum prep,uchar *tplout,int *newstyle)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  objnum *__src;
  size_t __n;
  bool bVar4;
  objnum verb;
  int *local_40;
  uchar *local_38;
  
  local_38 = tplout;
  uVar1 = objgetap(ctx->voccxmem,verb_in,0x2e,&verb,0);
  bVar4 = uVar1 == 0;
  if (bVar4) {
    uVar1 = objgetap(ctx->voccxmem,verb_in,0x12,&verb,0);
  }
  bVar4 = !bVar4;
  *newstyle = (uint)bVar4;
  local_40 = newstyle;
  do {
    while( true ) {
      if (uVar1 != 0) {
        __n = 0x10;
        if (!bVar4) {
          __n = 10;
        }
        puVar3 = mcmlck(ctx->voccxmem,verb);
        __src = (objnum *)(puVar3 + (ulong)uVar1 + 7);
        uVar2 = (uint)puVar3[(ulong)uVar1 + 6];
        while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
          if (*__src == prep) {
            mcmunlck(ctx->voccxmem,verb);
            memcpy(local_38,__src,__n);
            return 1;
          }
          __src = (objnum *)((long)__src + __n);
        }
        mcmunlck(ctx->voccxmem,verb);
      }
      uVar1 = objgetap(ctx->voccxmem,verb_in,0x2e,&verb,1);
      if (uVar1 == 0) break;
      *local_40 = 1;
      bVar4 = true;
      verb_in = verb;
    }
    uVar1 = objgetap(ctx->voccxmem,verb_in,0x12,&verb,1);
    *local_40 = 0;
    bVar4 = false;
    verb_in = verb;
  } while (uVar1 != 0);
  return 0;
}

Assistant:

int voctplfnd(voccxdef *ctx, objnum verb_in, objnum prep,
              uchar *tplout, int *newstyle)
{
    uchar  *tplptr;
    uchar  *thistpl;
    int     found;
    int     tplcnt;
    uint    tplofs;
    objnum  verb;

    /* look for a new-style template first */
    tplofs = objgetap(ctx->voccxmem, verb_in, PRP_TPL2, &verb, FALSE);
    if (tplofs)
    {
        /* flag the presence of the new-style template */
        *newstyle = TRUE;
    }
    else
    {
        /* no new-style template - look for old version */
        tplofs = objgetap(ctx->voccxmem, verb_in, PRP_TPL, &verb, FALSE);
        *newstyle = FALSE;
    }

    /* inherit templates until we run out of them */
    for (;;)
    {
        /* if we found something already, use it */
        if (tplofs)
        {
            size_t siz;

            /* figure the size of this template style */
            siz = (*newstyle ? VOCTPL2SIZ : VOCTPLSIZ);
            
            /* lock the verb object, and get the property value pointer */
            tplptr  = mcmlck(ctx->voccxmem, verb);
            thistpl = prpvalp(tplptr + tplofs);
            
            /* first byte is number of templates in array */
            tplcnt = *thistpl++;
            
            /* look for a template that matches the preposition object */
            for (found = FALSE ; tplcnt ; thistpl += siz, --tplcnt)
            {
                if (voctplpr(thistpl) == prep)
                {
                    found = TRUE;
                    break;
                }
            }
            
            /* unlock the object and return the value if we found one */
            mcmunlck(ctx->voccxmem, verb);
            if (found)
            {
                memcpy(tplout, thistpl, siz);
                return(TRUE);
            }
        }

        /* try inheriting a template (new-style, then old-style) */
        tplofs = objgetap(ctx->voccxmem, verb_in, PRP_TPL2, &verb, TRUE);
        if (tplofs)
            *newstyle = TRUE;
        else
        {
            tplofs = objgetap(ctx->voccxmem, verb_in, PRP_TPL, &verb, TRUE);
            *newstyle = FALSE;
        }

        /* return not-found if we couldn't inherit it */
        if (!tplofs)
            return FALSE;

        /* use the newly found verb */
        verb_in = verb;
    }
}